

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSocket.cpp
# Opt level: O2

void __thiscall cplus::socket::SocketServer::SocketServer(SocketServer *this,uint16_t port)

{
  int iVar1;
  ServerException *pSVar2;
  socklen_t in_ECX;
  int __n;
  sockaddr *in_RDX;
  int __fd;
  undefined6 in_register_00000032;
  allocator local_b2;
  allocator local_b1;
  String local_b0;
  String local_98;
  String local_80;
  string local_68;
  string local_48;
  Long local_28;
  
  __fd = (int)CONCAT62(in_register_00000032,port);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_toString_00128230;
  (this->server_addr).sin_family = 0;
  (this->server_addr).sin_port = 0;
  (this->server_addr).sin_addr = 0;
  (this->server_addr).sin_zero[0] = '\0';
  (this->server_addr).sin_zero[1] = '\0';
  (this->server_addr).sin_zero[2] = '\0';
  (this->server_addr).sin_zero[3] = '\0';
  (this->server_addr).sin_zero[4] = '\0';
  (this->server_addr).sin_zero[5] = '\0';
  (this->server_addr).sin_zero[6] = '\0';
  (this->server_addr).sin_zero[7] = '\0';
  this->server_socket = 0;
  this->lengthOfListenQueue = 0x14;
  iVar1 = bind(this,__fd,in_RDX,in_ECX);
  if (iVar1 != 0) {
    pSVar2 = (ServerException *)__cxa_allocate_exception(0x838);
    std::__cxx11::string::string((string *)&local_48,"Server Bind Port : ",&local_b1);
    local_28.value = (int64_t)port;
    local_28.super_Object._vptr_Object = (_func_int **)&PTR_toString_001285e8;
    lang::Long::toString(&local_b0,&local_28);
    lang::operator+(&local_98,&local_48,&local_b0);
    std::__cxx11::string::string((string *)&local_68," Failed!",&local_b2);
    lang::String::operator+(&local_80,&local_98,&local_68);
    ServerException::ServerException(pSVar2,&local_80);
    __cxa_throw(pSVar2,&ServerException::typeinfo,system::Exception::~Exception);
  }
  iVar1 = listen(this,__fd,__n);
  if (iVar1 == 0) {
    return;
  }
  pSVar2 = (ServerException *)__cxa_allocate_exception(0x838);
  ServerException::ServerException(pSVar2,"Server Listen Failed!");
  __cxa_throw(pSVar2,&ServerException::typeinfo,system::Exception::~Exception);
}

Assistant:

SocketServer::SocketServer(uint16_t port) {
			//把socket和socket地址结构联系起来
			if (bind(port)) {
				throw ServerException("Server Bind Port : " + lang::Long(port).toString() + " Failed!");
			}
			//server_socket用于监听
			if (listen()) {
				throw ServerException("Server Listen Failed!");
			}
		}